

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

void __thiscall Js::PolymorphicInlineCache::Dump(PolymorphicInlineCache *this)

{
  uint i;
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < this->size; uVar1 = uVar1 + 1) {
    if (*(long *)((long)&this->inlineCaches->u + lVar2) != 0) {
      Output::Print(L"  %d: ",uVar1 & 0xffffffff);
      InlineCache::Dump((InlineCache *)((long)&this->inlineCaches->u + lVar2));
      Output::Print(L"\n");
    }
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void PolymorphicInlineCache::Dump()
    {
        for (uint i = 0; i < size; ++i)
        {
            if (!inlineCaches[i].IsEmpty())
            {
                Output::Print(_u("  %d: "), i);
                inlineCaches[i].Dump();
                Output::Print(_u("\n"));
            }
        }
    }